

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecc-arithmetic.c
# Opt level: O0

void ecc_weierstrass_get_affine(WeierstrassPoint *wp,mp_int **x,mp_int **y)

{
  WeierstrassCurve *pWVar1;
  mp_int *pmVar2;
  WeierstrassCurve *wc;
  mp_int **y_local;
  mp_int **x_local;
  WeierstrassPoint *wp_local;
  
  pWVar1 = wp->wc;
  ecc_weierstrass_normalise(wp);
  if (x != (mp_int **)0x0) {
    pmVar2 = monty_export(pWVar1->mc,wp->X);
    *x = pmVar2;
  }
  if (y != (mp_int **)0x0) {
    pmVar2 = monty_export(pWVar1->mc,wp->Y);
    *y = pmVar2;
  }
  return;
}

Assistant:

void ecc_weierstrass_get_affine(
    WeierstrassPoint *wp, mp_int **x, mp_int **y)
{
    WeierstrassCurve *wc = wp->wc;

    ecc_weierstrass_normalise(wp);

    if (x)
        *x = monty_export(wc->mc, wp->X);
    if (y)
        *y = monty_export(wc->mc, wp->Y);
}